

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O2

void __thiscall
UI::showDeliveryPath
          (UI *this,vector<int,_std::allocator<int>_> *path,vector<int,_std::allocator<int>_> *POIs)

{
  pointer piVar1;
  pointer piVar2;
  Graph<std::pair<double,_double>_> *pGVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  int iVar5;
  int iVar6;
  GraphViewer *pGVar7;
  reference pvVar8;
  Vertex<std::pair<double,_double>_> *pVVar9;
  uint poi_n;
  uint uVar10;
  int i;
  int id;
  ulong __n;
  long lVar11;
  pair<double,_double> pVar12;
  allocator local_69;
  long local_68;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  string local_50;
  
  pGVar7 = (GraphViewer *)operator_new(0x18);
  GraphViewer::GraphViewer(pGVar7,this->gv_width,this->gv_height,false);
  this->gv = pGVar7;
  GraphViewer::defineEdgeCurved(pGVar7,false);
  GraphViewer::defineVertexSize(this->gv,3);
  GraphViewer::createWindow(this->gv,this->gv_width,this->gv_height);
  piVar1 = (POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pGVar3 = this->graph;
  local_58 = path;
  pvVar8 = std::vector<int,_std::allocator<int>_>::at(path,0);
  pVVar9 = Graph<std::pair<double,_double>_>::findVertex(pGVar3,pvVar8);
  pGVar7 = this->gv;
  pVar12 = Vertex<std::pair<double,_double>_>::getInfo(pVVar9);
  iVar5 = x_fitted(this,pVar12.first);
  pVar12 = Vertex<std::pair<double,_double>_>::getInfo(pVVar9);
  iVar6 = y_fitted(this,pVar12.second);
  GraphViewer::addNode(pGVar7,0,iVar5,iVar6);
  poi_n = 0xffffffff;
  if (piVar1 != piVar2) {
    iVar5 = Vertex<std::pair<double,_double>_>::getId(pVVar9);
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(POIs,0);
    poi_n = 0;
    if (iVar5 == *pvVar8) {
      setPOIProperties(this,pVVar9,0,0);
      poi_n = -(uint)((ulong)((long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start) < 5) | 1;
    }
  }
  lVar11 = 0;
  local_60 = POIs;
  for (__n = 1; __n < (ulong)((long)(local_58->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_58->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 2); __n = __n + 1) {
    pGVar3 = this->graph;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(local_58,__n);
    pVVar9 = Graph<std::pair<double,_double>_>::findVertex(pGVar3,pvVar8);
    pGVar7 = this->gv;
    pVar12 = Vertex<std::pair<double,_double>_>::getInfo(pVVar9);
    iVar5 = x_fitted(this,pVar12.first);
    pVar12 = Vertex<std::pair<double,_double>_>::getInfo(pVVar9);
    iVar6 = y_fitted(this,pVar12.second);
    id = (int)__n;
    GraphViewer::addNode(pGVar7,id,iVar5,iVar6);
    uVar10 = 0xffffffff;
    if (poi_n != 0xffffffff) {
      local_68 = lVar11;
      iVar5 = Vertex<std::pair<double,_double>_>::getId(pVVar9);
      pvVar4 = local_60;
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(local_60,(long)(int)poi_n);
      lVar11 = local_68;
      uVar10 = poi_n;
      if (iVar5 == *pvVar8) {
        setPOIProperties(this,pVVar9,id,poi_n);
        uVar10 = poi_n + 1;
        lVar11 = local_68;
        if ((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= (ulong)(long)(int)uVar10) {
          uVar10 = 0xffffffff;
        }
      }
    }
    GraphViewer::addEdge(this->gv,id,(int)lVar11,id,1);
    lVar11 = lVar11 + 1;
    poi_n = uVar10;
  }
  GraphViewer::rearrange(this->gv);
  std::__cxx11::string::string((string *)&local_50,"ENTER to go back",&local_69);
  enterWait(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  operator_delete(this->gv,0x18);
  return;
}

Assistant:

void UI::showDeliveryPath(vector<int> path, vector<int> POIs) {
    this->gv = new GraphViewer(gv_width, gv_height, false);
    gv->defineEdgeCurved(false);
    gv->defineVertexSize(3);
    gv->createWindow(gv_width, gv_height);
    int current_POI = -1;

    if (!POIs.empty()) {
        current_POI = 0;
    }

    Vertex<coordinates> *a = graph->findVertex(path.at(0));
    gv->addNode(0, x_fitted(a->getInfo().first), y_fitted(a->getInfo().second));
    if (current_POI != -1 && a->getId() == POIs.at(current_POI)) {
        setPOIProperties(a, 0, current_POI);
        if (++current_POI >= POIs.size()) { current_POI = -1; }
    }

    for (int i = 1; i < path.size(); i++) {
        a = graph->findVertex(path.at(i));

        gv->addNode(i, x_fitted(a->getInfo().first), y_fitted(a->getInfo().second));
        if (current_POI != -1 && a->getId() == POIs.at(current_POI)) {
            setPOIProperties(a, i, current_POI);
            if (++current_POI >= POIs.size()) { current_POI = -1; }
        }
        gv->addEdge(i, i-1, i, EdgeType::DIRECTED);
    }

    gv->rearrange();

    enterWait();
    delete gv;
}